

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

int Ssc_GiaTransferPiPattern(Gia_Man_t *pAig,Gia_Man_t *pCare,Vec_Int_t *vPivot)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  word *pwVar4;
  word *pwVar5;
  int iVar6;
  uint uVar7;
  word *__ptr;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar15 = (long)pCare->vSimsPi->nSize / (long)(pCare->vCis->nSize - pCare->nRegs);
  __ptr = Ssc_GiaGetCareMask(pCare);
  iVar11 = (int)uVar15;
  if (iVar11 < 1) {
    iVar10 = 0;
    if (__ptr == (word *)0x0) {
      return 0;
    }
  }
  else {
    uVar15 = uVar15 & 0xffffffff;
    uVar9 = 0;
    iVar10 = 0;
    do {
      uVar12 = __ptr[uVar9] - (__ptr[uVar9] >> 1 & 0x5555555555555555);
      uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
      uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
      uVar12 = (uVar12 >> 8) + uVar12;
      lVar13 = (uVar12 >> 0x10) + uVar12;
      iVar10 = iVar10 + ((int)((ulong)lVar13 >> 0x20) + (int)lVar13 & 0xffU);
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
    if (iVar10 == 0) {
      iVar10 = 0;
    }
    else {
      Ssc_GiaResetPiPattern(pAig,iVar11);
      iVar11 = pCare->vCis->nSize;
      if (0 < (long)iVar11) {
        piVar3 = pCare->vCis->pArray;
        lVar13 = 0;
        do {
          iVar1 = piVar3[lVar13];
          if ((iVar1 < 0) || (pCare->nObjs <= iVar1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pCare->pObjs == (Gia_Obj_t *)0x0) break;
          iVar2 = pAig->vSimsPi->nSize;
          iVar8 = iVar2 / (pAig->vCis->nSize - pAig->nRegs);
          iVar6 = (int)lVar13 * iVar8;
          if ((((iVar6 < 0) || (iVar2 <= iVar6)) ||
              (uVar7 = (pCare->vSimsPi->nSize / (iVar11 - pCare->nRegs)) * iVar1, (int)uVar7 < 0))
             || (pCare->vSims->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          if (vPivot->nSize <= lVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pwVar4 = pAig->vSimsPi->pArray;
          pwVar5 = pCare->vSims->pArray;
          iVar1 = vPivot->pArray[lVar13];
          uVar9 = 0;
          do {
            uVar12 = pwVar5[uVar7 + uVar9];
            uVar14 = ~__ptr[uVar9] | uVar12;
            if (iVar1 == 0) {
              uVar14 = __ptr[uVar9] & uVar12;
            }
            pwVar4[(uint)(iVar8 * (int)lVar13) + uVar9] = uVar14;
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar11);
      }
    }
  }
  free(__ptr);
  return iVar10;
}

Assistant:

int Ssc_GiaTransferPiPattern( Gia_Man_t * pAig, Gia_Man_t * pCare, Vec_Int_t * vPivot )
{
    extern word * Ssc_GiaGetCareMask( Gia_Man_t * p );
    Gia_Obj_t * pObj;
    int i, w, nWords = Gia_ObjSimWords( pCare );
    word * pCareMask = Ssc_GiaGetCareMask( pCare );
    int Count = Ssc_SimCountBits( pCareMask, nWords );
    word * pSimPiCare, * pSimPiAig;
    if ( Count == 0 )
    {
        ABC_FREE( pCareMask );
        return 0;
    }
    Ssc_GiaResetPiPattern( pAig, nWords );
    Gia_ManForEachCi( pCare, pObj, i )
    {
        pSimPiAig  = Gia_ObjSimPi( pAig, i );
        pSimPiCare = Gia_ObjSimObj( pCare, pObj );
        for ( w = 0; w < nWords; w++ )
            if ( Vec_IntEntry(vPivot, i) )
                pSimPiAig[w] = pSimPiCare[w] | ~pCareMask[w];
            else
                pSimPiAig[w] = pSimPiCare[w] & pCareMask[w];
    }
    ABC_FREE( pCareMask );
    return Count;
}